

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

uint32_t uprv_decNumberToUInt32_63(decNumber *dn,decContext *set)

{
  uint local_34;
  uint32_t lo;
  uint32_t hi;
  uint8_t *up;
  int32_t d;
  decContext *set_local;
  decNumber *dn_local;
  
  if (((((dn->bits & 0x70) == 0) && (dn->digits < 0xb)) && (dn->exponent == 0)) &&
     (((dn->bits & 0x80) == 0 ||
      (((dn->lsu[0] == '\0' && (dn->digits == 1)) && ((dn->bits & 0x70) == 0)))))) {
    local_34 = 0;
    _lo = &dn->field_0xa;
    for (up._4_4_ = 1; up._4_4_ < dn->digits; up._4_4_ = up._4_4_ + 1) {
      local_34 = (uint)*_lo * DECPOWERS[up._4_4_ + -1] + local_34;
      _lo = _lo + 1;
    }
    if ((local_34 < 0x1999999a) && ((local_34 != 0x19999999 || (dn->lsu[0] < 6)))) {
      return local_34 * 10 + (uint)dn->lsu[0];
    }
  }
  uprv_decContextSetStatus_63(set,0x80);
  return 0;
}

Assistant:

U_CAPI uInt U_EXPORT2 uprv_decNumberToUInt32(const decNumber *dn, decContext *set) {
  #if DECCHECK
  if (decCheckOperands(DECUNRESU, DECUNUSED, dn, set)) return 0;
  #endif
  /* special or too many digits, or bad exponent, or negative (<0)  */
  if (dn->bits&DECSPECIAL || dn->digits>10 || dn->exponent!=0
    || (dn->bits&DECNEG && !ISZERO(dn)));                   /* bad  */
   else { /* is a finite integer with 10 or fewer digits  */
    Int d;                         /* work  */
    const Unit *up;                /* ..  */
    uInt hi=0, lo;                 /* ..  */
    up=dn->lsu;                    /* -> lsu  */
    lo=*up;                        /* get 1 to 9 digits  */
    #if DECDPUN>1                  /* split to higher  */
      hi=lo/10;
      lo=lo%10;
    #endif
    up++;
    /* collect remaining Units, if any, into hi  */
    for (d=DECDPUN; d<dn->digits; up++, d+=DECDPUN) hi+=*up*powers[d-1];

    /* now low has the lsd, hi the remainder  */
    if (hi>429496729 || (hi==429496729 && lo>5)) ; /* no reprieve possible  */
     else return X10(hi)+lo;
    } /* integer  */
  uprv_decContextSetStatus(set, DEC_Invalid_operation); /* [may not return]  */
  return 0;
  }